

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::SetProperty
          (CustomExternalWrapperObject *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  Type *pTVar3;
  code *pcVar4;
  ThreadContext *this_00;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  Attributes attributes;
  JavascriptFunction *function;
  undefined4 *puVar8;
  RecyclableObject *ptr;
  Var pvVar9;
  anon_class_56_7_b8deb65f local_80;
  JavascriptFunction *local_48;
  JavascriptString *local_40;
  ThreadContext *local_38;
  
  local_40 = propertyNameString;
  BVar7 = VerifyObjectAlive(this);
  if (BVar7 == 0) {
    return 0;
  }
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  local_38 = pSVar2->threadContext;
  BVar7 = EnsureInitialized(this,pSVar2);
  if (BVar7 == 0) {
    return 0;
  }
  pTVar3 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  pvVar9 = *(Var *)&(pTVar3[1].propertyCache.ptr)->elements[0].field_0x8;
  if (pvVar9 == (Var)0x0) {
    pvVar9 = CrossSite::MarshalVar
                       ((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                        scriptContext.ptr,value,false);
    BVar7 = DynamicObject::SetProperty(&this->super_DynamicObject,local_40,pvVar9,flags,info);
    return BVar7;
  }
  function = VarTo<Js::JavascriptFunction>(pvVar9);
  bVar5 = ScriptContext::IsHeapEnumInProgress
                    ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    local_48 = function;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x27a,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
    function = local_48;
  }
  this_00 = local_38;
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  if (function == (JavascriptFunction *)0x0) {
    return 0;
  }
  local_80.threadContext = local_38;
  local_80.propertyName = local_40;
  bVar5 = local_38->reentrancySafeOrHandled;
  local_38->reentrancySafeOrHandled = true;
  local_80.setMethod = function;
  local_80.targetObj = (RecyclableObject *)this;
  local_80.newValue = value;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar6 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar6) {
    ptr = (RecyclableObject *)anon_func::anon_class_56_7_b8deb65f::operator()(&local_80);
    bVar6 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00a1154f;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      ptr = (RecyclableObject *)anon_func::anon_class_56_7_b8deb65f::operator()(&local_80);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00a1154f;
    }
    ptr = (RecyclableObject *)anon_func::anon_class_56_7_b8deb65f::operator()(&local_80);
    bVar6 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar6 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00a1154f:
  this_00->reentrancySafeOrHandled = bVar5;
  BVar7 = JavascriptConversion::ToBoolean(ptr,pSVar2);
  return BVar7;
}

Assistant:

BOOL CustomExternalWrapperObject::SetProperty(Js::JavascriptString* propertyNameString, Js::Var value, Js::PropertyOperationFlags flags, Js::PropertyValueInfo* info)
{
    if (!this->VerifyObjectAlive()) return FALSE;
    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return propertyNameString;
    };

    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    };

    return SetPropertyTrap(this, CustomExternalWrapperObject::SetPropertyTrapKind::SetPropertyKind, getPropertyName, value, GetScriptContext(), flags, FALSE, fn, info);
}